

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O1

void __thiscall TPZGeoMesh::RestoreReference(TPZGeoMesh *this,TPZCompMesh *cmesh)

{
  long lVar1;
  TPZCompEl *this_00;
  TPZCompEl **ppTVar2;
  TPZGeoEl *pTVar3;
  long nelem;
  
  ResetReference(this);
  this->fReference = cmesh;
  lVar1 = (cmesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  if (0 < lVar1) {
    nelem = 0;
    do {
      ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(cmesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
      this_00 = *ppTVar2;
      if (this_00 != (TPZCompEl *)0x0) {
        pTVar3 = TPZCompEl::Reference(this_00);
        if (pTVar3 == (TPZGeoEl *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "RestoreReference incomplete. Exist computational element with geometrical\n",
                     0x4a);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"element not belongs to the current geometrical mesh.\n",
                     0x35);
          return;
        }
        pTVar3->fReference = this_00;
      }
      nelem = nelem + 1;
    } while (lVar1 != nelem);
  }
  return;
}

Assistant:

void TPZGeoMesh::RestoreReference(TPZCompMesh *cmesh)
{
	ResetReference();
	fReference = cmesh;
	TPZGeoEl *gel;
	TPZCompEl *cel;
	int64_t i,nelem = cmesh->ElementVec().NElements();
	for(i=0;i<nelem;i++)
	{
		cel = cmesh->ElementVec()[i];
		if(cel)
		{
			gel = cel->Reference();
			if(!gel)
			{
				PZError << "RestoreReference incomplete. Exist computational element with geometrical\n";
				PZError << "element not belongs to the current geometrical mesh.\n";
				return;
			}
			gel->SetReference(cel);
		}
	}
}